

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

string * __thiscall
vkt::shaderexecutor::intervalToString<tcu::Vector<float,2>>
          (string *__return_storage_ptr__,shaderexecutor *this,FloatFormat *fmt,IVal *ival)

{
  ostringstream oss;
  IVal local_1c8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1c8.m_data[0]._0_8_ = *(undefined8 *)fmt;
  local_1c8.m_data[0].m_lo = *(double *)&fmt->m_fractionBits;
  local_1c8.m_data[0].m_hi = *(double *)&fmt->m_hasInf;
  local_1c8.m_data[1].m_hi = *(double *)(fmt + 1);
  local_1c8.m_data[1].m_hasNaN = fmt->m_exactPrecision;
  local_1c8.m_data[1]._1_7_ = *(undefined7 *)&fmt->field_0x19;
  local_1c8.m_data[1].m_lo = fmt->m_maxValue;
  ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doPrintIVal
            ((FloatFormat *)this,&local_1c8,(ostream *)local_198);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string intervalToString (const FloatFormat& fmt, const typename Traits<T>::IVal& ival)
{
	ostringstream oss;
	printIVal<T>(fmt, ival, oss);
	return oss.str();
}